

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogBuffer.cpp
# Opt level: O1

void __thiscall
helics::LogBuffer::push(LogBuffer *this,int logLevel,string_view header,string_view message)

{
  _Map_pointer pptVar1;
  handle block;
  int local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  LogBuffer *local_28;
  unique_lock<std::shared_timed_mutex> local_20;
  
  local_48._M_str = message._M_str;
  local_48._M_len = message._M_len;
  local_38._M_str = header._M_str;
  local_38._M_len = header._M_len;
  if ((this->mMaxSize).super___atomic_base<unsigned_long>._M_i != 0) {
    local_20._M_device = (mutex_type *)&(this->mBuffer).m_mutex;
    local_20._M_owns = false;
    local_4c = logLevel;
    local_28 = this;
    std::unique_lock<std::shared_timed_mutex>::lock(&local_20);
    local_20._M_owns = true;
    pptVar1 = (local_28->mBuffer).m_obj.
              super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (((long)(local_28->mBuffer).m_obj.
               super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last -
         (long)(local_28->mBuffer).m_obj.
               super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x71c71c71c71c71c7 +
        ((long)(local_28->mBuffer).m_obj.
               super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur -
         (long)(local_28->mBuffer).m_obj.
               super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x71c71c71c71c71c7 +
        (((long)pptVar1 -
          (long)(local_28->mBuffer).m_obj.
                super__Deque_base<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(pptVar1 == (_Map_pointer)0x0)) * 7 ==
        (this->mMaxSize).super___atomic_base<unsigned_long>._M_i) {
      std::
      deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop_front((deque<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_28);
    }
    std::
    deque<std::tuple<int,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<int,std::__cxx11::string,std::__cxx11::string>>>
    ::
    emplace_back<int&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((deque<std::tuple<int,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<int,std::__cxx11::string,std::__cxx11::string>>>
                *)local_28,&local_4c,&local_38,&local_48);
    std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_20);
  }
  return;
}

Assistant:

void LogBuffer::push(int logLevel, std::string_view header, std::string_view message)
{
    if (mMaxSize.load() == 0) {
        return;
    }
    auto block = mBuffer.lock();
    if (block->size() == mMaxSize.load()) {
        block->pop_front();
    }
    block->emplace_back(logLevel, header, message);
}